

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O2

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::ForeignKeyConstraint::Deserialize(ForeignKeyConstraint *this,Deserializer *deserializer)

{
  ForeignKeyConstraint *this_00;
  pointer pFVar1;
  _Head_base<0UL,_duckdb::ForeignKeyConstraint_*,_false> local_20;
  
  this_00 = (ForeignKeyConstraint *)operator_new(0xb8);
  ForeignKeyConstraint(this_00);
  local_20._M_head_impl = this_00;
  pFVar1 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,200,"pk_columns",&pFVar1->pk_columns);
  pFVar1 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xc9,"fk_columns",&pFVar1->fk_columns);
  pFVar1 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::ForeignKeyType>
            (deserializer,0xca,"fk_type",&(pFVar1->info).type);
  pFVar1 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xcb,"schema",&(pFVar1->info).schema);
  pFVar1 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xcc,"table",&(pFVar1->info).table);
  pFVar1 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (deserializer,0xcd,"pk_keys",&(pFVar1->info).pk_keys);
  pFVar1 = unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
           ::operator->((unique_ptr<duckdb::ForeignKeyConstraint,_std::default_delete<duckdb::ForeignKeyConstraint>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (deserializer,0xce,"fk_keys",&(pFVar1->info).fk_keys);
  (this->super_Constraint)._vptr_Constraint = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> ForeignKeyConstraint::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ForeignKeyConstraint>(new ForeignKeyConstraint());
	deserializer.ReadPropertyWithDefault<vector<string>>(200, "pk_columns", result->pk_columns);
	deserializer.ReadPropertyWithDefault<vector<string>>(201, "fk_columns", result->fk_columns);
	deserializer.ReadProperty<ForeignKeyType>(202, "fk_type", result->info.type);
	deserializer.ReadPropertyWithDefault<string>(203, "schema", result->info.schema);
	deserializer.ReadPropertyWithDefault<string>(204, "table", result->info.table);
	deserializer.ReadPropertyWithDefault<vector<PhysicalIndex>>(205, "pk_keys", result->info.pk_keys);
	deserializer.ReadPropertyWithDefault<vector<PhysicalIndex>>(206, "fk_keys", result->info.fk_keys);
	return std::move(result);
}